

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall r_code::list<r_exec::CInput>::__erase(list<r_exec::CInput> *this,int64_t c)

{
  int64_t iVar1;
  reference pvVar2;
  int64_t c_local;
  list<r_exec::CInput> *this_local;
  
  pvVar2 = std::
           vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
           ::operator[](&this->cells,c);
  if (pvVar2->prev == -1) {
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,c);
    this->used_cells_head = pvVar2->next;
  }
  else {
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,c);
    iVar1 = pvVar2->next;
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,c);
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,pvVar2->prev);
    pvVar2->next = iVar1;
  }
  pvVar2 = std::
           vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
           ::operator[](&this->cells,c);
  if (pvVar2->next == -1) {
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,c);
    this->used_cells_tail = pvVar2->prev;
  }
  else {
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,c);
    iVar1 = pvVar2->prev;
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,c);
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[](&this->cells,pvVar2->next);
    pvVar2->prev = iVar1;
  }
  iVar1 = this->free_cells;
  pvVar2 = std::
           vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
           ::operator[](&this->cells,c);
  pvVar2->next = iVar1;
  this->free_cells = c;
  this->free_cell_count = this->free_cell_count + 1;
  this->used_cell_count = this->used_cell_count - 1;
  return;
}

Assistant:

void __erase(int64_t c)
    {
        if (cells[c].prev != null) {
            cells[cells[c].prev].next = cells[c].next;
        } else {
            used_cells_head = cells[c].next;
        }

        if (cells[c].next != null) {
            cells[cells[c].next].prev = cells[c].prev;
        } else {
            used_cells_tail = cells[c].prev;
        }

        cells[c].next = free_cells;
        free_cells = c;
        ++free_cell_count;
        --used_cell_count;
    }